

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-writer-test.cc
# Opt level: O2

void __thiscall
ExprWriterTest_WriteBinaryLogicalExpr_Test::~ExprWriterTest_WriteBinaryLogicalExpr_Test
          (ExprWriterTest_WriteBinaryLogicalExpr_Test *this)

{
  ~ExprWriterTest_WriteBinaryLogicalExpr_Test
            ((ExprWriterTest_WriteBinaryLogicalExpr_Test *)&this[-1].super_ExprWriterTest.l0);
  return;
}

Assistant:

TEST_F(ExprWriterTest, WriteBinaryLogicalExpr) {
  auto e1 = MakeRelational(ex::GT, MakeVariable(0), MakeConst(0));
  auto e2 = MakeRelational(ex::LT, MakeVariable(0), MakeConst(10));
  CHECK_WRITE("if x1 > 0 || x1 < 10 then 1",
      MakeIf(MakeBinaryLogical(ex::OR, e1, e2), MakeConst(1), MakeConst(0)));
  CHECK_WRITE("if x1 > 0 && x1 < 10 then 1",
      MakeIf(MakeBinaryLogical(ex::AND, e1, e2), MakeConst(1), MakeConst(0)));
  CHECK_WRITE("if x1 > 0 <==> x1 < 10 then 1",
      MakeIf(MakeBinaryLogical(ex::IFF, e1, e2), MakeConst(1), MakeConst(0)));
}